

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O2

void __thiscall Pl_AES_PDF::initializeVector(Pl_AES_PDF *this)

{
  undefined8 uVar1;
  uchar uVar2;
  uint i;
  long lVar3;
  uint i_1;
  
  if (this->use_zero_iv == true) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      this->cbc_block[lVar3] = '\0';
    }
  }
  else {
    if (this->use_specified_iv == true) {
      uVar1 = *(undefined8 *)(this->specified_iv + 8);
      *(undefined8 *)this->cbc_block = *(undefined8 *)this->specified_iv;
      *(undefined8 *)(this->cbc_block + 8) = uVar1;
      return;
    }
    if (!use_static_iv) {
      QUtil::initializeWithRandomBytes(this->cbc_block,0x10);
      return;
    }
    uVar2 = '\x0e';
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      this->cbc_block[lVar3] = uVar2;
      uVar2 = uVar2 + '\x0e';
    }
  }
  return;
}

Assistant:

void
Pl_AES_PDF::initializeVector()
{
    if (use_zero_iv) {
        for (unsigned int i = 0; i < this->buf_size; ++i) {
            this->cbc_block[i] = 0;
        }
    } else if (use_specified_iv) {
        std::memcpy(this->cbc_block, this->specified_iv, this->buf_size);
    } else if (use_static_iv) {
        for (unsigned int i = 0; i < this->buf_size; ++i) {
            this->cbc_block[i] = static_cast<unsigned char>(14U * (1U + i));
        }
    } else {
        QUtil::initializeWithRandomBytes(this->cbc_block, this->buf_size);
    }
}